

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_array_copy
          (CompilerMSL *this,string *lhs,uint32_t rhs_id,StorageClass lhs_storage,
          StorageClass rhs_storage)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  Types TVar3;
  uint32_t uVar4;
  Variant *pVVar5;
  size_t sVar6;
  CompilerError *pCVar7;
  uint32_t id;
  bool local_151;
  bool local_141;
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined1 local_f0 [48];
  string local_c0 [32];
  char *local_a0;
  char *tag;
  SPVFuncImpl func;
  byte local_69;
  SPIRVariable *pSStack_68;
  bool is_constant;
  SPIRVariable *var;
  SPIRType *type;
  undefined1 local_48 [35];
  bool local_25;
  StorageClass local_24;
  bool rhs_thread;
  float fStack_20;
  bool lhs_thread;
  StorageClass rhs_storage_local;
  StorageClass lhs_storage_local;
  uint32_t rhs_id_local;
  string *lhs_local;
  CompilerMSL *this_local;
  
  local_141 = true;
  if (((lhs_storage != StorageClassOutput) &&
      (local_141 = true, lhs_storage != StorageClassFunction)) &&
     (local_141 = true, lhs_storage != StorageClassGeneric)) {
    local_141 = lhs_storage == StorageClassPrivate;
  }
  local_25 = local_141;
  local_151 = true;
  if (((rhs_storage != StorageClassInput) && (local_151 = true, rhs_storage != StorageClassFunction)
      ) && (local_151 = true, rhs_storage != StorageClassGeneric)) {
    local_151 = rhs_storage == StorageClassPrivate;
  }
  local_48[0x22] = local_151;
  id = (uint32_t)this;
  local_24 = rhs_storage;
  fStack_20 = (float)lhs_storage;
  rhs_storage_local = rhs_id;
  _lhs_storage_local = lhs;
  lhs_local = (string *)this;
  if (((local_141 != false) && (local_151 != false)) &&
     (bVar2 = using_builtin_array(this), pbVar1 = _lhs_storage_local, !bVar2)) {
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_48,id,SUB41(rhs_storage_local,0));
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,pbVar1,(char (*) [4])0x4f38c2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_48);
    return;
  }
  var = (SPIRVariable *)Compiler::expression_type((Compiler *)this,rhs_storage_local);
  pSStack_68 = Compiler::maybe_get_backing_variable((Compiler *)this,rhs_storage_local);
  local_69 = 0;
  pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>,(ulong)rhs_storage_local);
  TVar3 = Variant::get_type(pVVar5);
  if (TVar3 == TypeConstant) {
    local_69 = 1;
  }
  else {
    if (((pSStack_68 != (SPIRVariable *)0x0) && ((pSStack_68->remapped_variable & 1U) != 0)) &&
       ((pSStack_68->statically_assigned & 1U) != 0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_68->static_expression);
      pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>,(ulong)uVar4);
      TVar3 = Variant::get_type(pVVar5);
      if (TVar3 == TypeConstant) {
        local_69 = 1;
        goto LAB_003fefc4;
      }
    }
    if (local_24 == StorageClassUniform) {
      local_69 = 1;
    }
  }
LAB_003fefc4:
  sVar6 = VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>);
  if (sVar6 < 2) {
    add_spv_func_and_recompile(this,SPVFuncImplArrayCopy);
  }
  else {
    sVar6 = VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>)
    ;
    if (6 < sVar6) {
      tag._6_1_ = 1;
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&func,"Cannot support this many dimensions for arrays of arrays.",
                 (allocator *)((long)&tag + 7));
      CompilerError::CompilerError(pCVar7,(string *)&func);
      tag._6_1_ = 0;
      __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar6 = VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>)
    ;
    tag._0_4_ = (int)sVar6 + SPVFuncImplArrayCopyMultidimBase;
    add_spv_func_and_recompile(this,(SPVFuncImpl)tag);
  }
  local_a0 = (char *)0x0;
  if (((local_25 & 1U) == 0) || ((local_69 & 1) == 0)) {
    if ((fStack_20 == 5.60519e-45) && ((local_69 & 1) != 0)) {
      local_a0 = "FromConstantToThreadGroup";
    }
    else if (((local_25 & 1U) == 0) || ((local_48[0x22] & 1) == 0)) {
      if ((fStack_20 == 5.60519e-45) && ((local_48[0x22] & 1) != 0)) {
        local_a0 = "FromStackToThreadGroup";
      }
      else if (((local_25 & 1U) == 0) || (local_24 != StorageClassWorkgroup)) {
        if ((fStack_20 == 5.60519e-45) && (local_24 == StorageClassWorkgroup)) {
          local_a0 = "FromThreadGroupToThreadGroup";
        }
        else if ((fStack_20 == 1.68156e-44) && (local_24 == StorageClassStorageBuffer)) {
          local_a0 = "FromDeviceToDevice";
        }
        else if ((fStack_20 == 1.68156e-44) && ((local_69 & 1) != 0)) {
          local_a0 = "FromConstantToDevice";
        }
        else if ((fStack_20 == 1.68156e-44) && (local_24 == StorageClassWorkgroup)) {
          local_a0 = "FromThreadGroupToDevice";
        }
        else if ((fStack_20 == 1.68156e-44) && ((local_48[0x22] & 1) != 0)) {
          local_a0 = "FromStackToDevice";
        }
        else if ((fStack_20 == 5.60519e-45) && (local_24 == StorageClassStorageBuffer)) {
          local_a0 = "FromDeviceToThreadGroup";
        }
        else {
          if (((local_25 & 1U) == 0) || (local_24 != StorageClassStorageBuffer)) {
            local_f0[0x2e] = '\x01';
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_c0,"Unknown storage class used for copying arrays.",
                       (allocator *)(local_f0 + 0x2f));
            CompilerError::CompilerError(pCVar7,(string *)local_c0);
            local_f0[0x2e] = '\0';
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          local_a0 = "FromDeviceToStack";
        }
      }
      else {
        local_a0 = "FromThreadGroupToStack";
      }
    }
    else {
      local_a0 = "FromStackToStack";
    }
  }
  else {
    local_a0 = "FromConstantToStack";
  }
  if (((local_25 & 1U) == 0) || (((this->msl_options).force_native_arrays & 1U) != 0)) {
    if (((local_48[0x22] & 1) == 0) || (((this->msl_options).force_native_arrays & 1U) != 0)) {
      local_140._32_8_ =
           VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>);
      pbVar1 = _lhs_storage_local;
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_140,id,SUB41(rhs_storage_local,0));
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [13])0x4ea0c8,&local_a0,
                 (unsigned_long *)(local_140 + 0x20),(char (*) [2])0x4f3f9c,pbVar1,
                 (char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 (char (*) [3])0x4d9ce1);
      ::std::__cxx11::string::~string((string *)local_140);
    }
    else {
      local_118._32_8_ =
           VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>);
      pbVar1 = _lhs_storage_local;
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_118,id,SUB41(rhs_storage_local,0));
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[12]>
                (&this->super_CompilerGLSL,(char (*) [13])0x4ea0c8,&local_a0,
                 (unsigned_long *)(local_118 + 0x20),(char (*) [2])0x4f3f9c,pbVar1,
                 (char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 (char (*) [12])".elements);");
      ::std::__cxx11::string::~string((string *)local_118);
    }
  }
  else {
    local_f0._32_8_ =
         VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>);
    pbVar1 = _lhs_storage_local;
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_f0,id,SUB41(rhs_storage_local,0));
    CompilerGLSL::
    statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])0x4ea0c8,&local_a0,
               (unsigned_long *)(local_f0 + 0x20),(char (*) [2])0x4f3f9c,pbVar1,
               (char (*) [12])".elements, ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               (char (*) [3])0x4d9ce1);
    ::std::__cxx11::string::~string((string *)local_f0);
  }
  return;
}

Assistant:

void CompilerMSL::emit_array_copy(const string &lhs, uint32_t rhs_id, StorageClass lhs_storage,
                                  StorageClass rhs_storage)
{
	// Allow Metal to use the array<T> template to make arrays a value type.
	// This, however, cannot be used for threadgroup address specifiers, so consider the custom array copy as fallback.
	bool lhs_thread = (lhs_storage == StorageClassOutput || lhs_storage == StorageClassFunction ||
	                   lhs_storage == StorageClassGeneric || lhs_storage == StorageClassPrivate);
	bool rhs_thread = (rhs_storage == StorageClassInput || rhs_storage == StorageClassFunction ||
	                   rhs_storage == StorageClassGeneric || rhs_storage == StorageClassPrivate);

	// If threadgroup storage qualifiers are *not* used:
	// Avoid spvCopy* wrapper functions; Otherwise, spvUnsafeArray<> template cannot be used with that storage qualifier.
	if (lhs_thread && rhs_thread && !using_builtin_array())
	{
		statement(lhs, " = ", to_expression(rhs_id), ";");
	}
	else
	{
		// Assignment from an array initializer is fine.
		auto &type = expression_type(rhs_id);
		auto *var = maybe_get_backing_variable(rhs_id);

		// Unfortunately, we cannot template on address space in MSL,
		// so explicit address space redirection it is ...
		bool is_constant = false;
		if (ir.ids[rhs_id].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (var && var->remapped_variable && var->statically_assigned &&
		         ir.ids[var->static_expression].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (rhs_storage == StorageClassUniform)
		{
			is_constant = true;
		}

		// For the case where we have OpLoad triggering an array copy,
		// we cannot easily detect this case ahead of time since it's
		// context dependent. We might have to force a recompile here
		// if this is the only use of array copies in our shader.
		if (type.array.size() > 1)
		{
			if (type.array.size() > kArrayCopyMultidimMax)
				SPIRV_CROSS_THROW("Cannot support this many dimensions for arrays of arrays.");
			auto func = static_cast<SPVFuncImpl>(SPVFuncImplArrayCopyMultidimBase + type.array.size());
			add_spv_func_and_recompile(func);
		}
		else
			add_spv_func_and_recompile(SPVFuncImplArrayCopy);

		const char *tag = nullptr;
		if (lhs_thread && is_constant)
			tag = "FromConstantToStack";
		else if (lhs_storage == StorageClassWorkgroup && is_constant)
			tag = "FromConstantToThreadGroup";
		else if (lhs_thread && rhs_thread)
			tag = "FromStackToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_thread)
			tag = "FromStackToThreadGroup";
		else if (lhs_thread && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToThreadGroup";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && is_constant)
			tag = "FromConstantToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_thread)
			tag = "FromStackToDevice";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToThreadGroup";
		else if (lhs_thread && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToStack";
		else
			SPIRV_CROSS_THROW("Unknown storage class used for copying arrays.");

		// Pass internal array of spvUnsafeArray<> into wrapper functions
		if (lhs_thread && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ".elements, ", to_expression(rhs_id), ");");
		else if (rhs_thread && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ", ", to_expression(rhs_id), ".elements);");
		else
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ", ", to_expression(rhs_id), ");");
	}
}